

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::initializeSpecialStreams(QPDFWriter *this)

{
  element_type *peVar1;
  key_type kVar2;
  bool bVar3;
  int iVar4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  mapped_type *pmVar5;
  int iVar6;
  string *key;
  int iVar7;
  QPDFObjGen *c;
  key_type __k;
  vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> contents_objects;
  QPDFObjectHandle contents;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> pages;
  _Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_> local_98;
  string *local_78;
  QPDFObjGen local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  QPDFObjGen local_60;
  QPDFObjectHandle local_58;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_48;
  
  __x = QPDF::getAllPages(((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_48,__x);
  local_78 = (string *)
             local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  iVar6 = 0;
  for (key = (string *)
             local_48.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
             _M_impl.super__Vector_impl_data._M_start; key != local_78;
      key = (string *)&key->field_2) {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._M_impl.super__Vector_impl_data._M_start =
         (pointer)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)key);
    pmVar5 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[](&peVar1->page_object_to_seq,(key_type *)&local_98);
    iVar6 = iVar6 + 1;
    *pmVar5 = iVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"/Contents",(allocator<char> *)&local_70);
    QPDFObjectHandle::getKey(&local_58,key);
    std::__cxx11::string::~string((string *)&local_98);
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = QPDFObjectHandle::isArray(&local_58);
    if (bVar3) {
      iVar4 = QPDFObjectHandle::getArrayNItems(&local_58);
      iVar7 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
        iVar7 = 0;
      }
      for (; __k = (key_type)local_98._M_impl.super__Vector_impl_data._M_start,
          kVar2 = (key_type)local_98._M_impl.super__Vector_impl_data._M_finish, iVar4 != iVar7;
          iVar7 = iVar7 + 1) {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_70,(int)&local_58);
        local_60 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_70);
        std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::emplace_back<QPDFObjGen>
                  ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&local_98,&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      }
    }
    else {
      bVar3 = QPDFObjectHandle::isStream(&local_58);
      __k = (key_type)local_98._M_impl.super__Vector_impl_data._M_start;
      kVar2 = (key_type)local_98._M_impl.super__Vector_impl_data._M_finish;
      if (bVar3) {
        local_70 = QPDFObjectHandle::getObjGen(&local_58);
        std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>::emplace_back<QPDFObjGen>
                  ((vector<QPDFObjGen,_std::allocator<QPDFObjGen>_> *)&local_98,&local_70);
        __k = (key_type)local_98._M_impl.super__Vector_impl_data._M_start;
        kVar2 = (key_type)local_98._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    for (; __k != kVar2; __k = (key_type)((long)__k + 8)) {
      pmVar5 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->contents_to_page_seq,(key_type *)__k);
      *pmVar5 = iVar6;
      std::
      _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
      ::_M_insert_unique<QPDFObjGen_const&>
                ((_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                  *)&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->normalized_streams,(QPDFObjGen *)__k);
    }
    std::_Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>::~_Vector_base(&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_48);
  return;
}

Assistant:

void
QPDFWriter::initializeSpecialStreams()
{
    // Mark all page content streams in case we are filtering or normalizing.
    std::vector<QPDFObjectHandle> pages = m->pdf.getAllPages();
    int num = 0;
    for (auto& page: pages) {
        m->page_object_to_seq[page.getObjGen()] = ++num;
        QPDFObjectHandle contents = page.getKey("/Contents");
        std::vector<QPDFObjGen> contents_objects;
        if (contents.isArray()) {
            int n = contents.getArrayNItems();
            for (int i = 0; i < n; ++i) {
                contents_objects.push_back(contents.getArrayItem(i).getObjGen());
            }
        } else if (contents.isStream()) {
            contents_objects.push_back(contents.getObjGen());
        }

        for (auto const& c: contents_objects) {
            m->contents_to_page_seq[c] = num;
            m->normalized_streams.insert(c);
        }
    }
}